

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

bool anon_unknown.dwarf_193d67::IsNonLocalValue(VmInstruction *inst)

{
  bool bVar1;
  uint uVar2;
  VmValue **ppVVar3;
  VmInstruction *pVVar4;
  VmInstruction *user;
  uint i;
  VmInstruction *inst_local;
  
  bVar1 = SmallArray<VmValue_*,_8U>::empty(&(inst->super_VmValue).users);
  if (!bVar1) {
    for (user._4_4_ = 0; uVar2 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users),
        user._4_4_ < uVar2; user._4_4_ = user._4_4_ + 1) {
      ppVVar3 = SmallArray<VmValue_*,_8U>::operator[](&(inst->super_VmValue).users,user._4_4_);
      pVVar4 = getType<VmInstruction>(*ppVVar3);
      if (inst->parent != pVVar4->parent) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IsNonLocalValue(VmInstruction *inst)
	{
		if(inst->users.empty())
			return false;

		for(unsigned i = 0; i < inst->users.size(); i++)
		{
			VmInstruction *user = getType<VmInstruction>(inst->users[i]);

			if(inst->parent != user->parent)
				return true;
		}

		return false;
	}